

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O1

bool __thiscall
QHttpNetworkConnectionPrivate::shouldEmitChannelError
          (QHttpNetworkConnectionPrivate *this,QIODevice *socket)

{
  NetworkLayerPreferenceState NVar1;
  QObject *pQVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int __fd;
  QHttpNetworkConnectionChannel *this_00;
  long in_FS_OFFSET;
  bool bVar6;
  void *local_48;
  char *pcStack_40;
  QMetaTypeInterface *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = *(QObject **)&this->field_0x8;
  iVar5 = indexOf(this,socket);
  __fd = (int)socket;
  cVar3 = QTimer::isActive();
  if (cVar3 != '\0') {
    QTimer::stop();
    QHttpNetworkConnectionChannel::ensureConnection
              ((QHttpNetworkConnectionChannel *)
               (&this->channels->super_QObject +
               ((uint)(iVar5 == 0) * 0x100 + (uint)(iVar5 == 0) * 8)));
  }
  NVar1 = this->networkLayerState;
  if (this->activeChannelCount < this->channelCount) {
    if ((NVar1 == IPv4or6) || (NVar1 == HostLookupPending)) {
      this->networkLayerState = Unknown;
    }
    this_00 = this->channels;
LAB_00200fb8:
    QHttpNetworkConnectionChannel::close((QHttpNetworkConnectionChannel *)this_00,__fd);
    bVar4 = true;
  }
  else {
    bVar4 = true;
    switch(NVar1) {
    case HostLookupPending:
    case IPv4or6:
      bVar6 = iVar5 == 0;
      bVar4 = QHttpNetworkConnectionChannel::isSocketBusy
                        ((QHttpNetworkConnectionChannel *)
                         (&this->channels->super_QObject + ((uint)bVar6 * 0x100 + (uint)bVar6 * 8)))
      ;
      if ((bVar4) &&
         (*(int *)((long)&this->channels->state + (ulong)((uint)bVar6 * 0x100 + (uint)bVar6 * 8)) !=
          0x10)) {
        QHttpNetworkConnectionChannel::close
                  ((QHttpNetworkConnectionChannel *)(this->channels + iVar5),__fd);
        bVar4 = false;
        goto LAB_00201065;
      }
      this->networkLayerState = Unknown;
      this_00 = this->channels + iVar5;
      goto LAB_00200fb8;
    case IPv4:
      __fd = iVar5 * 0x100;
      if (this->channels[iVar5].networkLayerPreference != IPv4Protocol) goto LAB_00201008;
      if (NVar1 == IPv6) goto switchD_00200f5a_caseD_3;
      break;
    case IPv6:
switchD_00200f5a_caseD_3:
      if (this->channels[iVar5].networkLayerPreference != IPv6Protocol) {
LAB_00201008:
        QHttpNetworkConnectionChannel::close
                  ((QHttpNetworkConnectionChannel *)(this->channels + iVar5),__fd);
        local_48 = (void *)0x0;
        pcStack_40 = (char *)0x0;
        local_38 = (QMetaTypeInterface *)0x0;
        QMetaObject::invokeMethodImpl
                  (pQVar2,"_q_startNextRequest",QueuedConnection,1,&local_48,&pcStack_40,&local_38);
        bVar4 = false;
      }
    }
    if (this->networkLayerState == Unknown) {
      shouldEmitChannelError();
    }
  }
LAB_00201065:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QHttpNetworkConnectionPrivate::shouldEmitChannelError(QIODevice *socket)
{
    Q_Q(QHttpNetworkConnection);

    bool emitError = true;
    int i = indexOf(socket);
    int otherSocket = (i == 0 ? 1 : 0);

    // If the IPv4 connection still isn't started we need to start it now.
    if (delayedConnectionTimer.isActive()) {
        delayedConnectionTimer.stop();
        channels[otherSocket].ensureConnection();
    }

    if (activeChannelCount < channelCount) {
        if (networkLayerState == HostLookupPending || networkLayerState == IPv4or6)
            networkLayerState = QHttpNetworkConnectionPrivate::Unknown;
        channels[0].close();
        emitError = true;
    } else {
        if (networkLayerState == HostLookupPending || networkLayerState == IPv4or6) {
            if (channels[otherSocket].isSocketBusy() && (channels[otherSocket].state != QHttpNetworkConnectionChannel::ClosingState)) {
                // this was the first socket to fail.
                channels[i].close();
                emitError = false;
            }
            else {
                // Both connection attempts has failed.
                networkLayerState = QHttpNetworkConnectionPrivate::Unknown;
                channels[i].close();
                emitError = true;
            }
        } else {
            if (((networkLayerState == QHttpNetworkConnectionPrivate::IPv4) && (channels[i].networkLayerPreference != QAbstractSocket::IPv4Protocol))
                || ((networkLayerState == QHttpNetworkConnectionPrivate::IPv6) && (channels[i].networkLayerPreference != QAbstractSocket::IPv6Protocol))) {
                // First connection worked so this is the second one to complete and it failed.
                channels[i].close();
                QMetaObject::invokeMethod(q, "_q_startNextRequest", Qt::QueuedConnection);
                emitError = false;
            }
            if (networkLayerState == QHttpNetworkConnectionPrivate::Unknown)
                qWarning("We got a connection error when networkLayerState is Unknown");
        }
    }
    return emitError;
}